

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * __thiscall
kratos::port_dir_to_str_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,PortDirection direction)

{
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  PortDirection direction_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"input",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"output",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"inout",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string port_dir_to_str(PortDirection direction) {
    if (direction == PortDirection::In) {
        return "input";
    } else if (direction == PortDirection::Out) {
        return "output";
    } else {
        return "inout";
    }
}